

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::DelayedSequenceElementSyntax::setChild
          (DelayedSequenceElementSyntax *this,size_t index,TokenOrSyntax child)

{
  SelectorSyntax *pSVar1;
  ExpressionSyntax *pEVar2;
  SyntaxNode *pSVar3;
  logic_error *this_00;
  Token TVar4;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 7) {
    switch(index) {
    case 0:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->doubleHash).kind = TVar4.kind;
      (this->doubleHash).field_0x2 = TVar4._2_1_;
      (this->doubleHash).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->doubleHash).rawLen = TVar4.rawLen;
      (this->doubleHash).info = TVar4.info;
      break;
    case 1:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        pEVar2 = (ExpressionSyntax *)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        pEVar2 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar3);
      }
      this->delayVal = pEVar2;
      break;
    case 2:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->openBracket).kind = TVar4.kind;
      (this->openBracket).field_0x2 = TVar4._2_1_;
      (this->openBracket).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->openBracket).rawLen = TVar4.rawLen;
      (this->openBracket).info = TVar4.info;
      break;
    case 3:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->op).kind = TVar4.kind;
      (this->op).field_0x2 = TVar4._2_1_;
      (this->op).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->op).rawLen = TVar4.rawLen;
      (this->op).info = TVar4.info;
      break;
    case 4:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        pSVar1 = (SelectorSyntax *)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        pSVar1 = SyntaxNode::as<slang::syntax::SelectorSyntax>(pSVar3);
      }
      this->range = pSVar1;
      break;
    case 5:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->closeBracket).kind = TVar4.kind;
      (this->closeBracket).field_0x2 = TVar4._2_1_;
      (this->closeBracket).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->closeBracket).rawLen = TVar4.rawLen;
      (this->closeBracket).info = TVar4.info;
      break;
    case 6:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p =
             (pointer)SyntaxNode::as<slang::syntax::SequenceExprSyntax>(pSVar3);
      }
      not_null<slang::syntax::SequenceExprSyntax*>::
      not_null<slang::syntax::SequenceExprSyntax*,void>
                ((not_null<slang::syntax::SequenceExprSyntax*> *)&local_b8,
                 (SequenceExprSyntax **)&local_d8);
      (this->expr).ptr = (SequenceExprSyntax *)local_b8._M_dataplus._M_p;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0x1099);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void DelayedSequenceElementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: doubleHash = child.token(); return;
        case 1: delayVal = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 2: openBracket = child.token(); return;
        case 3: op = child.token(); return;
        case 4: range = child.node() ? &child.node()->as<SelectorSyntax>() : nullptr; return;
        case 5: closeBracket = child.token(); return;
        case 6: expr = child.node() ? &child.node()->as<SequenceExprSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}